

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QArrayDataPointer<char> *
QArrayDataPointer<char>::allocateGrow
          (QArrayDataPointer<char> *__return_storage_ptr__,QArrayDataPointer<char> *from,qsizetype n
          ,GrowthPosition position)

{
  Int IVar1;
  P _b;
  long lVar2;
  qsizetype qVar3;
  Data *pDVar4;
  long lVar5;
  Data *pDVar6;
  char *pcVar7;
  pair<QTypedArrayData<char>_*,_char_*> pVar8;
  
  pDVar4 = from->d;
  if (pDVar4 == (Data *)0x0) {
    qVar3 = 0;
  }
  else {
    qVar3 = (pDVar4->super_QArrayData).alloc;
  }
  if (qVar3 < from->size) {
    qVar3 = from->size;
  }
  if (position == GrowsAtEnd) {
    lVar2 = freeSpaceAtEnd(from);
  }
  else {
    lVar2 = (long)from->ptr -
            ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
    if (pDVar4 == (Data *)0x0) {
      lVar2 = 0;
    }
  }
  qVar3 = detachCapacity(from,(qVar3 + n) - lVar2);
  if (from->d == (Data *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = (from->d->super_QArrayData).alloc;
  }
  pVar8 = QTypedArrayData<char>::allocate(qVar3,(uint)(qVar3 <= lVar2));
  pcVar7 = pVar8.second;
  pDVar4 = pVar8.first;
  if (pcVar7 != (char *)0x0 && pDVar4 != (Data *)0x0) {
    if (position == GrowsAtBeginning) {
      lVar5 = ((pDVar4->super_QArrayData).alloc - (from->size + n)) / 2;
      lVar2 = 0;
      if (0 < lVar5) {
        lVar2 = lVar5;
      }
      lVar2 = lVar2 + n;
      pDVar6 = from->d;
    }
    else {
      pDVar6 = from->d;
      lVar2 = (long)from->ptr -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
      if (pDVar6 == (Data *)0x0) {
        lVar2 = 0;
      }
    }
    if (pDVar6 == (Data *)0x0) {
      IVar1 = 0;
    }
    else {
      IVar1 = (pDVar6->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>
              .super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
    pcVar7 = pcVar7 + lVar2;
    (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i = IVar1;
  }
  __return_storage_ptr__->d = pDVar4;
  __return_storage_ptr__->ptr = pcVar7;
  __return_storage_ptr__->size = 0;
  return __return_storage_ptr__;
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }